

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Own<kj::Filesystem,_std::nullptr_t> kj::newDiskFilesystem(void)

{
  bool bVar1;
  String *pSVar2;
  size_t sVar3;
  _func_int **pp_Var4;
  _func_int *p_Var5;
  __dev_t _Var6;
  __ino64_t _Var7;
  int iVar8;
  uint uVar9;
  _func_int **pp_Var10;
  size_t sVar11;
  OwnFd *__buf;
  char *pcVar12;
  char *pcVar13;
  int *piVar14;
  size_t in_RCX;
  char *pcVar15;
  Filesystem *extraout_RDX;
  Filesystem *extraout_RDX_00;
  Filesystem *extraout_RDX_01;
  Filesystem *extraout_RDX_02;
  Filesystem *extraout_RDX_03;
  Filesystem *pFVar16;
  Path *this;
  stat64 *__buf_00;
  OwnFd *pOVar17;
  Exception *e;
  Exception *this_00;
  Disposer *in_RDI;
  undefined1 auVar18 [8];
  Own<kj::Filesystem,_std::nullptr_t> OVar19;
  StringPtr path_00;
  StringPtr path_01;
  Path result;
  DebugComparison<const_char_&,_char> _kjCondition;
  Fault f;
  char *pwd;
  stat pwdStat;
  stat dotStat;
  Array<char> buf_heap;
  StringPtr path;
  char buf_stack [256];
  Path local_698;
  _func_int **local_680;
  undefined1 local_678 [8];
  _func_int *p_Stack_670;
  ArrayDisposer *pAStack_668;
  size_t local_660;
  bool local_658;
  PathPtr local_648;
  _func_int **local_638;
  Path *local_630;
  Exception *local_628;
  Disposer *local_620;
  stat64 local_618;
  bool local_588;
  undefined7 uStack_587;
  __ino64_t local_580;
  stat64 local_4f8 [2];
  StringPtr local_358 [25];
  undefined1 local_1c8 [408];
  
  local_620 = in_RDI;
  pp_Var10 = (_func_int **)operator_new(0x40);
  *pp_Var10 = (_func_int *)&PTR_getRoot_00710c50;
  local_680 = pp_Var10;
  anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)local_1c8,"/");
  pp_Var10[1] = (_func_int *)&PTR_getFd_0070fa90;
  *(undefined4 *)(pp_Var10 + 2) = local_1c8._0_4_;
  local_1c8._0_4_ = -1;
  pp_Var10[1] = (_func_int *)&PTR_getFd_007107c8;
  OwnFd::~OwnFd((OwnFd *)local_1c8);
  local_638 = pp_Var10 + 2;
  anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)local_1c8,".");
  pp_Var10[3] = (_func_int *)&PTR_getFd_0070fa90;
  *(undefined4 *)(pp_Var10 + 4) = local_1c8._0_4_;
  local_1c8._0_4_ = 0xffffffff;
  pp_Var10[3] = (_func_int *)&PTR_getFd_007107c8;
  OwnFd::~OwnFd((OwnFd *)local_1c8);
  local_630 = (Path *)(pp_Var10 + 5);
  local_628 = (Exception *)getenv("PWD");
  if (local_628 != (Exception *)0x0) {
    local_698.parts.ptr = (String *)0x0;
    local_698.parts.size_ = 0;
    local_698.parts.disposer = (ArrayDisposer *)0x0;
    local_658 = *(code *)&(local_628->ownFile).content.ptr == (code)0x2f;
    p_Stack_670 = (_func_int *)CONCAT71(p_Stack_670._1_7_,0x2f);
    pAStack_668 = (ArrayDisposer *)0x4fd0ae;
    local_660 = 5;
    local_678 = (undefined1  [8])local_628;
    if (local_658) {
      this = (Path *)((long)&(local_628->ownFile).content.ptr + 1);
      sVar11 = strlen((char *)this);
      path_00.content.size_ = in_RCX;
      path_00.content.ptr = (char *)(sVar11 + 1);
      Path::parse((Path *)local_678,this,path_00);
      sVar3 = local_698.parts.size_;
      pSVar2 = local_698.parts.ptr;
      if ((Exception *)local_698.parts.ptr != (Exception *)0x0) {
        local_698.parts.ptr = (String *)0x0;
        local_698.parts.size_ = 0;
        (**(local_698.parts.disposer)->_vptr_ArrayDisposer)
                  (local_698.parts.disposer,pSVar2,0x18,sVar3,sVar3,
                   ArrayDisposer::Dispose_<kj::String>::destruct);
      }
      local_698.parts.ptr = (String *)local_678;
      local_698.parts.size_ = (size_t)p_Stack_670;
      local_698.parts.disposer = pAStack_668;
      __buf_00 = &local_618;
      do {
        local_648.parts.ptr = local_698.parts.ptr;
        local_648.parts.size_ = local_698.parts.size_;
        PathPtr::toString((String *)local_678,&local_648,true);
        auVar18 = (undefined1  [8])(Exception *)0x54bab9;
        if (p_Stack_670 != (_func_int *)0x0) {
          auVar18 = local_678;
        }
        iVar8 = lstat64((char *)auVar18,__buf_00);
        p_Var5 = p_Stack_670;
        auVar18 = local_678;
        if (local_678 != (undefined1  [8])0x0) {
          local_678 = (undefined1  [8])0x0;
          p_Stack_670 = (_func_int *)0x0;
          (**pAStack_668->_vptr_ArrayDisposer)(pAStack_668,auVar18,1,p_Var5,p_Var5,0);
        }
        if (-1 < iVar8) {
          iVar8 = 0;
          break;
        }
        iVar8 = _::Debug::getOsErrorNumber(false);
      } while (iVar8 == -1);
      if (iVar8 == 0) {
        do {
          iVar8 = lstat64(".",(stat64 *)&local_588);
          if (-1 < iVar8) {
            iVar8 = 0;
            break;
          }
          uVar9 = _::Debug::getOsErrorNumber(false);
          __buf_00 = (stat64 *)((ulong)__buf_00 & 0xffffffff);
          if (uVar9 != 0xffffffff) {
            __buf_00 = (stat64 *)(ulong)uVar9;
          }
          iVar8 = (int)__buf_00;
        } while (uVar9 == 0xffffffff);
        if (iVar8 != 0) {
          local_648.parts.ptr = (String *)0x0;
          local_678 = (undefined1  [8])0x0;
          p_Stack_670 = (_func_int *)0x0;
          _::Debug::Fault::init
                    ((Fault *)&local_648,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                    );
          _::Debug::Fault::~Fault((Fault *)&local_648);
        }
      }
      else {
        _::Debug::Fault::Fault<int,kj::Path&>
                  ((Fault *)local_678,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6a0,iVar8,"lstat(result.toString(true).cStr(), &pwdStat)","result",&local_698)
        ;
        _::Debug::Fault::~Fault((Fault *)local_678);
      }
    }
    else {
      _::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char_const&,char>&>
                ((Fault *)&local_648,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x69e,FAILED,"pwd[0] == \'/\'","_kjCondition,",
                 (DebugComparison<const_char_&,_char> *)local_678);
      _::Debug::Fault::~Fault((Fault *)&local_648);
    }
    local_4f8[0].st_dev = local_4f8[0].st_dev & 0xffffffffffffff00;
    local_1c8._0_4_ = local_1c8._0_4_ & 0xffffff00;
    this_00 = (Exception *)(local_1c8 + 8);
    if ((local_618.st_ino == local_580) && (local_618.st_dev == CONCAT71(uStack_587,local_588))) {
      local_680[5] = (_func_int *)local_698.parts.ptr;
      local_680[6] = (_func_int *)local_698.parts.size_;
      local_680[7] = (_func_int *)local_698.parts.disposer;
      goto LAB_004f2c22;
    }
    if (_::Debug::minSeverity < 1) {
      _::Debug::log<char_const(&)[57],char_const*&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x6b1,INFO,"\"PWD environment variable doesn\'t match current directory\", pwd",
                 (char (*) [57])"PWD environment variable doesn\'t match current directory",
                 (char **)&local_628);
    }
    if (local_1c8[0] == '\x01') {
      Exception::~Exception(this_00);
    }
    sVar3 = local_698.parts.size_;
    pSVar2 = local_698.parts.ptr;
    if ((Exception *)local_698.parts.ptr != (Exception *)0x0) {
      local_698.parts.ptr = (String *)0x0;
      local_698.parts.size_ = 0;
      (**(local_698.parts.disposer)->_vptr_ArrayDisposer)
                (local_698.parts.disposer,pSVar2,0x18,sVar3,sVar3,
                 ArrayDisposer::Dispose_<kj::String>::destruct);
    }
  }
  this_00 = (Exception *)0x100;
  do {
    if (this_00 < (Exception *)0x101) {
      local_4f8[0].st_dev = 0;
      local_4f8[0].st_ino = 0;
      local_4f8[0].st_nlink = 0;
      __buf = (OwnFd *)local_1c8;
      pOVar17 = (OwnFd *)local_4f8[0].st_dev;
    }
    else {
      __buf = (OwnFd *)_::HeapArrayDisposer::allocateImpl
                                 (1,(size_t)this_00,(size_t)this_00,(_func_void_void_ptr *)0x0,
                                  (_func_void_void_ptr *)0x0);
      local_4f8[0].st_nlink = (__nlink_t)&_::HeapArrayDisposer::instance;
      local_4f8[0].st_ino = (__ino64_t)this_00;
      pOVar17 = __buf;
    }
    local_4f8[0].st_dev = (__dev_t)pOVar17;
    pcVar12 = getcwd((char *)__buf,(size_t)this_00);
    if (pcVar12 == (char *)0x0) {
      piVar14 = __errno_location();
      if (*piVar14 != 0x22) {
        local_618.st_dev = 0;
        local_358[0].content.ptr = (char *)0x0;
        local_358[0].content.size_ = 0;
        _::Debug::Fault::init
                  ((Fault *)&local_618,
                   (EVP_PKEY_CTX *)
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                  );
        _::Debug::Fault::fatal((Fault *)&local_618);
      }
      this_00 = (Exception *)((long)this_00 * 2);
    }
    else {
      pcVar13 = (char *)strlen((char *)__buf);
      local_358[0].content.size_ = (size_t)(pcVar13 + 1);
      pcVar15 = (char *)local_358[0].content.size_;
      local_358[0].content.ptr = (char *)__buf;
      if ((char *)0xc < pcVar13) {
        pcVar15 = (char *)(*(ulong *)__buf ^ 0x68636165726e7528);
        bVar1 = *(long *)((long)&__buf[1].fd + 1) == 0x29656c6261686361;
        local_588 = !bVar1 || pcVar15 != (char *)0x0;
        if (bVar1 && pcVar15 == (char *)0x0) {
          _::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[45],kj::StringPtr&>
                    ((Fault *)&local_618,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                     ,0x6c8,FAILED,"!path.startsWith(\"(unreachable)\")",
                     "_kjCondition,\"working directory is not reachable from root\", path",
                     (DebugExpression<bool> *)&local_588,
                     (char (*) [45])"working directory is not reachable from root",local_358);
          _::Debug::Fault::fatal((Fault *)&local_618);
        }
      }
      if (pcVar13 == (char *)0x0) {
        local_588 = false;
LAB_004f2d5c:
        _::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[34],kj::StringPtr&>
                  ((Fault *)&local_618,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x6c9,FAILED,"path.startsWith(\"/\")",
                   "_kjCondition,\"current directory is not absolute\", path",
                   (DebugExpression<bool> *)&local_588,
                   (char (*) [34])"current directory is not absolute",local_358);
        _::Debug::Fault::fatal((Fault *)&local_618);
      }
      local_588 = (char)__buf->fd == '/';
      if (!local_588) goto LAB_004f2d5c;
      if (this_00 < (Exception *)0x101) {
        pOVar17 = (OwnFd *)local_1c8;
      }
      path_01.content.size_ = (size_t)pcVar15;
      path_01.content.ptr = pcVar13;
      Path::parse(local_630,(Path *)((long)&pOVar17->fd + 1),path_01);
    }
    _Var7 = local_4f8[0].st_ino;
    _Var6 = local_4f8[0].st_dev;
    if ((OwnFd *)local_4f8[0].st_dev != (OwnFd *)0x0) {
      local_4f8[0].st_dev = 0;
      local_4f8[0].st_ino = 0;
      (*(code *)**(undefined8 **)local_4f8[0].st_nlink)(local_4f8[0].st_nlink,_Var6,1,_Var7,_Var7,0)
      ;
    }
  } while (pcVar12 == (char *)0x0);
LAB_004f2c22:
  pp_Var10 = local_638;
  do {
    iVar8 = stat64("/dev/..",(stat64 *)local_1c8);
    if (-1 < iVar8) {
      iVar8 = 0;
      pFVar16 = extraout_RDX;
      break;
    }
    uVar9 = _::Debug::getOsErrorNumber(false);
    this_00 = (Exception *)((ulong)this_00 & 0xffffffff);
    if (uVar9 != 0xffffffff) {
      this_00 = (Exception *)(ulong)uVar9;
    }
    iVar8 = (int)this_00;
    pFVar16 = extraout_RDX_00;
  } while (uVar9 == 0xffffffff);
  pp_Var4 = local_680;
  if (iVar8 == 0) {
    do {
      iVar8 = fstat64(*(int *)pp_Var10,local_4f8);
      if (-1 < iVar8) {
        iVar8 = 0;
        pFVar16 = extraout_RDX_01;
        break;
      }
      iVar8 = _::Debug::getOsErrorNumber(false);
      pFVar16 = extraout_RDX_02;
    } while (iVar8 == -1);
    if (iVar8 != 0) {
      local_618.st_dev = 0;
      local_358[0].content.ptr = (char *)0x0;
      local_358[0].content.size_ = 0;
      _::Debug::Fault::init
                ((Fault *)&local_618,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      _::Debug::Fault::fatal((Fault *)&local_618);
    }
    if (local_1c8._8_8_ != local_4f8[0].st_ino) {
      if (_::Debug::minSeverity < 2) {
        _::Debug::log<char_const(&)[75]>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x677,WARNING,
                   "\"root dir file descriptor is broken, probably because of qemu; compensating\"",
                   (char (*) [75])
                   "root dir file descriptor is broken, probably because of qemu; compensating");
      }
      anon_unknown_9::DiskFilesystem::openDir((DiskFilesystem *)&local_618,"/dev/..");
      local_358[0].content.ptr = (char *)CONCAT44(local_358[0].content.ptr._4_4_,*(int *)pp_Var10);
      *(int *)pp_Var10 = -1;
      *(int *)pp_Var10 = (int)local_618.st_dev;
      local_618.st_dev = CONCAT44(local_618.st_dev._4_4_,0xffffffff);
      OwnFd::~OwnFd((OwnFd *)local_358);
      OwnFd::~OwnFd((OwnFd *)&local_618);
      pFVar16 = extraout_RDX_03;
    }
  }
  local_620->_vptr_Disposer =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DiskFilesystem>::instance;
  local_620[1]._vptr_Disposer = pp_Var4;
  OVar19.ptr = pFVar16;
  OVar19.disposer = local_620;
  return OVar19;
}

Assistant:

Own<Filesystem> newDiskFilesystem() {
  return heap<DiskFilesystem>();
}